

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void mwStatistics(int level)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  mwAutoInit();
  iVar2 = 0;
  if (0 < level) {
    iVar2 = level;
  }
  if (mwStatLevel != iVar2) {
    pcVar1 = "line";
    if (level == 1) {
      pcVar1 = "module";
    }
    pcVar3 = "global";
    if (0 < level) {
      pcVar3 = pcVar1;
    }
    mwWrite("statistics: now collecting on a %s basis\n",pcVar3);
    mwStatLevel = iVar2;
  }
  return;
}

Assistant:

void mwStatistics(int level)
{
	mwAutoInit();
	if (level < 0) {
		level = 0;
	}
	if (mwStatLevel != level) {
		mwWrite("statistics: now collecting on a %s basis\n",
				level < 1 ? "global" : (level < 2 ? "module" : "line"));
		mwStatLevel = level;
	}
}